

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprSize(Expr *p)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int nByte;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = dupedExprNodeSize((Expr *)CONCAT44(0xaaaaaaaa,in_stack_fffffffffffffff0),
                            in_stack_ffffffffffffffec);
  if (*(long *)(in_RDI + 0x10) != 0) {
    iVar2 = dupedExprSize((Expr *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    iVar1 = iVar2 + iVar1;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    iVar2 = dupedExprSize((Expr *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    iVar1 = iVar2 + iVar1;
  }
  return iVar1;
}

Assistant:

static int dupedExprSize(const Expr *p){
  int nByte;
  assert( p!=0 );
  nByte = dupedExprNodeSize(p, EXPRDUP_REDUCE);
  if( p->pLeft ) nByte += dupedExprSize(p->pLeft);
  if( p->pRight ) nByte += dupedExprSize(p->pRight);
  assert( nByte==ROUND8(nByte) );
  return nByte;
}